

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

uint8_t __thiscall wabt::ElemSegment::GetFlags(ElemSegment *this,Module *module)

{
  SegmentKind SVar1;
  pointer piVar2;
  byte bVar3;
  byte bVar4;
  Index IVar5;
  pointer piVar6;
  pointer piVar7;
  long lVar8;
  bool bVar9;
  
  SVar1 = this->kind;
  if (SVar1 == Declared) {
    bVar3 = 3;
  }
  else if (SVar1 == Passive) {
    bVar3 = 1;
  }
  else if (SVar1 == Active) {
    IVar5 = BindingHash::FindIndex(&module->table_bindings,&this->table_var);
    bVar3 = ((this->elem_type).enum_ != FuncRef || IVar5 != 0) * '\x02';
  }
  else {
    bVar3 = 0;
  }
  if ((this->elem_type).enum_ != FuncRef) {
    bVar9 = false;
    goto LAB_0012a4d6;
  }
  piVar7 = (this->elem_exprs).
           super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar2 = (this->elem_exprs).
           super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = ((long)piVar2 - (long)piVar7 >> 3) * -0x5555555555555555 >> 2;
  piVar6 = piVar7;
  if (0 < lVar8) {
    piVar6 = piVar7 + lVar8 * 4;
    lVar8 = lVar8 + 1;
    piVar7 = piVar7 + 2;
    do {
      if (piVar7[-2].size_ == 0) goto LAB_0012a4e5;
      if ((piVar7[-2].first_)->type_ != RefFunc) {
        piVar7 = piVar7 + -2;
        goto LAB_0012a4d0;
      }
      if (piVar7[-1].size_ == 0) goto LAB_0012a4e5;
      if ((piVar7[-1].first_)->type_ != RefFunc) {
        piVar7 = piVar7 + -1;
        goto LAB_0012a4d0;
      }
      if (piVar7->size_ == 0) goto LAB_0012a4e5;
      if (piVar7->first_->type_ != RefFunc) goto LAB_0012a4d0;
      if (piVar7[1].size_ == 0) goto LAB_0012a4e5;
      if ((piVar7[1].first_)->type_ != RefFunc) {
        piVar7 = piVar7 + 1;
        goto LAB_0012a4d0;
      }
      lVar8 = lVar8 + -1;
      piVar7 = piVar7 + 4;
    } while (1 < lVar8);
  }
  lVar8 = ((long)piVar2 - (long)piVar6 >> 3) * -0x5555555555555555;
  if (lVar8 == 1) {
LAB_0012a4a5:
    if (piVar6->size_ == 0) {
LAB_0012a4e5:
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                    ,0x18a,
                    "typename intrusive_list<T>::const_reference wabt::intrusive_list<wabt::Expr>::front() const [T = wabt::Expr]"
                   );
    }
    piVar7 = piVar6;
    if (piVar6->first_->type_ == RefFunc) {
      piVar7 = piVar2;
    }
  }
  else if (lVar8 == 2) {
LAB_0012a491:
    if (piVar6->size_ == 0) goto LAB_0012a4e5;
    piVar7 = piVar6;
    if (piVar6->first_->type_ == RefFunc) {
      piVar6 = piVar6 + 1;
      goto LAB_0012a4a5;
    }
  }
  else {
    piVar7 = piVar2;
    if (lVar8 == 3) {
      if (piVar6->size_ == 0) goto LAB_0012a4e5;
      piVar7 = piVar6;
      if (piVar6->first_->type_ == RefFunc) {
        piVar6 = piVar6 + 1;
        goto LAB_0012a491;
      }
    }
  }
LAB_0012a4d0:
  bVar9 = piVar7 == piVar2;
LAB_0012a4d6:
  bVar4 = bVar3 | 4;
  if (bVar9) {
    bVar4 = bVar3;
  }
  return bVar4;
}

Assistant:

uint8_t ElemSegment::GetFlags(const Module* module) const {
  uint8_t flags = 0;

  switch (kind) {
    case SegmentKind::Active: {
      Index table_index = module->GetTableIndex(table_var);
      if (elem_type != Type::FuncRef || table_index != 0) {
        flags |= SegExplicitIndex;
      }
      break;
    }

    case SegmentKind::Passive:
      flags |= SegPassive;
      break;

    case SegmentKind::Declared:
      flags |= SegDeclared;
      break;
  }

  bool all_ref_func =
      elem_type == Type::FuncRef &&
      std::all_of(elem_exprs.begin(), elem_exprs.end(),
                  [](const ExprList& elem_expr) {
                    return elem_expr.front().type() == ExprType::RefFunc;
                  });

  if (!all_ref_func) {
    flags |= SegUseElemExprs;
  }

  return flags;
}